

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  long runs;
  long L;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  uint s;
  long lVar6;
  parameter_type P;
  parameter_type P_00;
  parameter_type P_01;
  parameter_type P_02;
  parameter_type P_03;
  parameter_type P_04;
  parameter_type P_05;
  minstd R;
  string generator;
  string arg;
  minstd mStack_1007c;
  char **ppcStack_10078;
  undefined1 *puStack_10070;
  char *pcStack_10068;
  undefined1 auStack_10060 [16];
  long lStack_10050;
  long lStack_10048;
  long lStack_10040;
  undefined1 auStack_10038 [16];
  undefined1 auStack_10028 [65528];
  
  puStack_10070 = auStack_10060;
  pcStack_10068 = (char *)0x0;
  auStack_10060[0] = 0;
  ppcStack_10078 = argv;
  if (argc == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Tina\'s Random Number Generator Library\n\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"(P) & (C) by Heiko Bauke, 2000-2022\n\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"two-domensional Ising model (Wolff algorithm)\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"---------------------------------------------\n\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"synopsis:\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"$ ",2);
    poVar3 = std::operator<<((ostream *)&std::cerr,*ppcStack_10078);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," --gen generator --runs runs --split split --size size\n",0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"try:\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"$ ",2);
    poVar3 = std::operator<<(poVar3,*ppcStack_10078);
    std::operator<<(poVar3," --gen lcg64 --runs 100000 --split 1 --size 16\n");
LAB_00103536:
    exit(1);
  }
  if (argc < 2) {
    lStack_10040 = 0;
    lStack_10050 = 0;
    lStack_10048 = 0;
  }
  else {
    lVar6 = 2;
    iVar4 = 1;
    lStack_10048 = 0;
    lStack_10050 = 0;
    lStack_10040 = 0;
    do {
      std::__cxx11::string::string
                ((string *)auStack_10038,argv[lVar6 + -1],(allocator *)&mStack_1007c);
      iVar2 = std::__cxx11::string::compare((char *)auStack_10038);
      pcVar1 = pcStack_10068;
      iVar5 = (int)lVar6;
      if (iVar2 == 0) {
        if (argc <= iVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"missung argument for parameter ",0x1f);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)auStack_10038._0_8_,auStack_10038._8_8_)
          ;
          std::operator<<(poVar3,'\n');
          goto LAB_00103536;
        }
        __s = ppcStack_10078[lVar6];
        strlen(__s);
        argv = ppcStack_10078;
        std::__cxx11::string::_M_replace((ulong)&puStack_10070,0,pcVar1,(ulong)__s);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)auStack_10038);
        if (iVar2 == 0) {
          if (argc <= iVar5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"missung argument for parameter ",0x1f);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)auStack_10038._0_8_,
                                auStack_10038._8_8_);
            std::operator<<(poVar3,'\n');
            goto LAB_00103536;
          }
          iVar2 = atoi(argv[lVar6]);
          lStack_10048 = (long)iVar2;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)auStack_10038);
          if (iVar2 == 0) {
            if (argc <= iVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"missung argument for parameter ",0x1f);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)auStack_10038._0_8_,
                                  auStack_10038._8_8_);
              std::operator<<(poVar3,'\n');
              goto LAB_00103536;
            }
            iVar2 = atoi(argv[lVar6]);
            lStack_10050 = (long)iVar2;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)auStack_10038);
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"unknown argument ",0x11);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)auStack_10038._0_8_,
                                  auStack_10038._8_8_);
              std::operator<<(poVar3,'\n');
              goto LAB_00103536;
            }
            if (argc <= iVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"missung argument for parameter ",0x1f);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)auStack_10038._0_8_,
                                  auStack_10038._8_8_);
              std::operator<<(poVar3,'\n');
              goto LAB_00103536;
            }
            iVar2 = atoi(argv[lVar6]);
            lStack_10040 = (long)iVar2;
          }
        }
      }
      if ((undefined1 *)auStack_10038._0_8_ != auStack_10028) {
        operator_delete((void *)auStack_10038._0_8_);
      }
      lVar6 = lVar6 + 2;
      iVar4 = iVar4 + 2;
    } while (iVar4 < argc);
  }
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64::lcg64((lcg64 *)auStack_10038,P);
  L = lStack_10040;
  runs = lStack_10048;
  lVar6 = lStack_10050;
  s = (uint)lStack_10050;
  trng::lcg64::split((lcg64 *)auStack_10038,s,0);
  trng::lcg64::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::lcg64>((lcg64 *)auStack_10038,runs,lVar6,L);
  }
  trng::mrg2::mrg2((mrg2 *)auStack_10038,(parameter_type)0x45335114595605e5);
  trng::mrg2::split((mrg2 *)auStack_10038,s,0);
  trng::mrg2::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::mrg2>((mrg2 *)auStack_10038,runs,lVar6,L);
  }
  P_02.a[2] = 0x75e21f71;
  P_02.a[0] = 0x787c73e9;
  P_02.a[1] = 0x6ce5b0df;
  trng::mrg3::mrg3((mrg3 *)auStack_10038,P_02);
  trng::mrg3::split((mrg3 *)auStack_10038,s,0);
  trng::mrg3::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::mrg3>((mrg3 *)auStack_10038,runs,lVar6,L);
  }
  P_03.a[2] = 0x79883501;
  P_03.a[0] = 0x78b65021;
  P_03.a[1] = 0x4256534d;
  trng::mrg3s::mrg3s((mrg3s *)auStack_10038,P_03);
  trng::mrg3s::split((mrg3s *)auStack_10038,s,0);
  trng::mrg3s::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::mrg3s>((mrg3s *)auStack_10038,runs,lVar6,L);
  }
  P_00.a[2] = 0x44ddb3f9;
  P_00.a[3] = 0x6370d8d2;
  P_00.a[0] = 0x7753d502;
  P_00.a[1] = 0x542dbf61;
  trng::mrg4::mrg4((mrg4 *)auStack_10038,P_00);
  trng::mrg4::split((mrg4 *)auStack_10038,s,0);
  trng::mrg4::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::mrg4>((mrg4 *)auStack_10038,runs,lVar6,L);
  }
  trng::mrg5::mrg5((mrg5 *)auStack_10038,(parameter_type *)trng::mrg5::LEcuyer1);
  trng::mrg5::split((mrg5 *)auStack_10038,s,0);
  trng::mrg5::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::mrg5>((mrg5 *)auStack_10038,runs,lVar6,L);
  }
  trng::mrg5s::mrg5s((mrg5s *)auStack_10038,(parameter_type *)trng::mrg5s::trng0);
  trng::mrg5s::split((mrg5s *)auStack_10038,s,0);
  trng::mrg5s::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::mrg5s>((mrg5s *)auStack_10038,runs,lVar6,L);
  }
  trng::yarn2::yarn2((yarn2 *)auStack_10038,trng::yarn2::LEcuyer1);
  trng::yarn2::split((yarn2 *)auStack_10038,s,0);
  trng::yarn2::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::yarn2>((yarn2 *)auStack_10038,runs,lVar6,L);
  }
  P_04.a[2] = DAT_00184220;
  P_04.a[0] = (undefined4)trng::yarn3::LEcuyer1;
  P_04.a[1] = trng::yarn3::LEcuyer1._4_4_;
  trng::yarn3::yarn3((yarn3 *)auStack_10038,P_04);
  trng::yarn3::split((yarn3 *)auStack_10038,s,0);
  trng::yarn3::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::yarn3>((yarn3 *)auStack_10038,runs,lVar6,L);
  }
  P_05.a[2] = DAT_001e4248;
  P_05.a[0] = (undefined4)trng::yarn3s::trng0;
  P_05.a[1] = trng::yarn3s::trng0._4_4_;
  trng::yarn3s::yarn3s((yarn3s *)auStack_10038,P_05);
  trng::yarn3s::split((yarn3s *)auStack_10038,s,0);
  trng::yarn3s::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::yarn3s>((yarn3s *)auStack_10038,runs,lVar6,L);
  }
  P_01.a[2] = (undefined4)DAT_00244268;
  P_01.a[3] = DAT_00244268._4_4_;
  P_01.a[0] = (undefined4)trng::yarn4::LEcuyer1;
  P_01.a[1] = trng::yarn4::LEcuyer1._4_4_;
  trng::yarn4::yarn4((yarn4 *)auStack_10038,P_01);
  trng::yarn4::split((yarn4 *)auStack_10038,s,0);
  trng::yarn4::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::yarn4>((yarn4 *)auStack_10038,runs,lVar6,L);
  }
  trng::yarn5::yarn5((yarn5 *)auStack_10038,(parameter_type *)trng::yarn5::LEcuyer1);
  trng::yarn5::split((yarn5 *)auStack_10038,s,0);
  trng::yarn5::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::yarn5>((yarn5 *)auStack_10038,runs,lVar6,L);
  }
  trng::yarn5s::yarn5s((yarn5s *)auStack_10038,(parameter_type *)trng::yarn5s::trng0);
  trng::yarn5s::split((yarn5s *)auStack_10038,s,0);
  trng::yarn5s::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::yarn5s>((yarn5s *)auStack_10038,runs,lVar6,L);
  }
  memset(auStack_10038,0,0x404);
  trng::minstd::minstd(&mStack_1007c,0);
  trng::lagfib2xor<unsigned_int,_103U,_250U>::seed<trng::minstd>
            ((lagfib2xor<unsigned_int,_103U,_250U> *)auStack_10038,&mStack_1007c);
  trng::lagfib2xor<unsigned_int,_103U,_250U>::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::lagfib2xor<unsigned_int,103u,250u>>
              ((lagfib2xor<unsigned_int,_103U,_250U> *)auStack_10038,runs,lVar6,L);
  }
  memset(auStack_10038,0,0x10004);
  trng::minstd::minstd(&mStack_1007c,0);
  trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::seed<trng::minstd>
            ((lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *)auStack_10038,&mStack_1007c);
  trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::name();
  iVar4 = std::__cxx11::string::compare((char *)&puStack_10070);
  if (iVar4 == 0) {
    wolff_main<trng::lagfib4xor<unsigned_int,471u,1586u,6988u,9689u>>
              ((lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *)auStack_10038,runs,lVar6,L);
  }
  if (puStack_10070 != auStack_10060) {
    operator_delete(puStack_10070);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  long runs{0}, split{0}, L{0};
  std::string generator;
  int argi{1};
  if (argc == 1) {
    std::cerr << "Tina's Random Number Generator Library\n\n"
              << "(P) & (C) by Heiko Bauke, 2000-2022\n\n"
              << "two-domensional Ising model (Wolff algorithm)\n"
              << "---------------------------------------------\n\n"
              << "synopsis:\n"
              << "$ " << argv[0] << " --gen generator --runs runs --split split --size size\n"
              << "try:\n"
              << "$ " << argv[0] << " --gen lcg64 --runs 100000 --split 1 --size 16\n";
    std::exit(EXIT_FAILURE);
  }
  while (argi < argc) {
    std::string arg(argv[argi]);
    if (arg == "--gen") {
      ++argi;
      if (argi < argc) {
        generator = argv[argi];
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--runs") {
      ++argi;
      if (argi < argc) {
        runs = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--split") {
      ++argi;
      if (argi < argc) {
        split = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--size") {
      ++argi;
      if (argi < argc) {
        L = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else {
      std::cerr << "unknown argument " << arg << '\n';
      std::exit(EXIT_FAILURE);
    }
  }
  {
    trng::lcg64 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg2 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg3 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg3s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg4 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg5 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg5s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn2 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn3 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn3s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn4 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn5 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn5s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::r250_32 r;
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::Ziff_32 r;
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  return EXIT_SUCCESS;
}